

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_rules.hpp
# Opt level: O1

void ovf::detail::parse::v2::ovf_segment_data_action<ovf::detail::parse::v2::text_value_float>::
     apply<tao::pegtl::internal::action_input<tao::pegtl::memory_input<(tao::pegtl::tracking_mode)0,tao::pegtl::ascii::eol::lf_crlf,std::__cxx11::string>>,double>
               (action_input<tao::pegtl::memory_input<(tao::pegtl::tracking_mode)0,_tao::pegtl::ascii::eol::lf_crlf,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *in,ovf_file *f,ovf_segment *segment,double *data)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  parser_state *ppVar5;
  char *__nptr;
  int *piVar6;
  undefined8 uVar7;
  long lVar8;
  double dVar9;
  char *local_58 [2];
  char local_48 [16];
  char *local_38;
  
  iVar1 = f->_state->current_line;
  iVar2 = f->_state->current_column;
  iVar3 = segment->valuedim;
  local_58[0] = local_48;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_58,(in->m_begin).data,
             (in->m_input->
             super_memory_input_base<(tao::pegtl::tracking_mode)0,_tao::pegtl::ascii::eol::lf_crlf,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ).m_current.data);
  __nptr = local_58[0];
  piVar6 = __errno_location();
  iVar4 = *piVar6;
  *piVar6 = 0;
  dVar9 = strtod(__nptr,&local_38);
  if (local_38 == __nptr) {
    uVar7 = std::__throw_invalid_argument("stod");
    if (*piVar6 == 0) {
      *piVar6 = iVar4;
    }
    if (local_58[0] != local_48) {
      operator_delete(local_58[0]);
    }
    _Unwind_Resume(uVar7);
  }
  if (*piVar6 != 0) {
    if (*piVar6 != 0x22) goto LAB_001510e5;
    dVar9 = (double)std::__throw_out_of_range("stod");
  }
  *piVar6 = iVar4;
LAB_001510e5:
  if (local_58[0] != local_48) {
    operator_delete(local_58[0]);
  }
  lVar8 = (long)iVar3 * (long)iVar1 + (long)iVar2;
  ppVar5 = f->_state;
  if ((int)lVar8 < ppVar5->max_data_index) {
    data[lVar8] = dVar9;
    piVar6 = &ppVar5->current_column;
    *piVar6 = *piVar6 + 1;
  }
  return;
}

Assistant:

static void apply( const Input& in, ovf_file & f, const ovf_segment & segment, scalar * data )
            {
                int row = f._state->current_line;
                int col = f._state->current_column;

                int n_cols = segment.valuedim;

                double value = std::stod(in.string());

                int idx = col + row*n_cols;

                if( idx < f._state->max_data_index )
                {
                    data[idx] = value;
                    ++f._state->current_column;
                }
            }